

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O0

void DrawCmdLabel(ECommand_t cmd,int x,int y)

{
  char cVar1;
  int iVar2;
  char c;
  int y_local;
  int x_local;
  ECommand_t cmd_local;
  
  cVar1 = ctrl_GetCmdKey(cmd);
  iVar2 = toupper((int)cVar1);
  cVar1 = (char)iVar2;
  if (cVar1 == '\t') {
    mvwprintw(_stdscr,y,x,"[tab]");
  }
  else if (cVar1 == '\n') {
    mvwprintw(_stdscr,y,x,"[enter]");
  }
  else if (cVar1 == ' ') {
    mvwprintw(_stdscr,y,x,"[space]");
  }
  else {
    iVar2 = wmove(_stdscr,y,x);
    if (iVar2 != -1) {
      waddch(_stdscr,(int)cVar1);
    }
  }
  return;
}

Assistant:

static void DrawCmdLabel(ECommand_t cmd, int x, int y)
{
  char c = toupper(ctrl_GetCmdKey(cmd));
  switch (c) {
    case ' ': mvwprintw(stdscr, y, x, "[space]"); break;
    case '\n': mvwprintw(stdscr, y, x, "[enter]"); break;
    case '\t': mvwprintw(stdscr, y, x, "[tab]"); break;
    default: mvwaddch(stdscr, y, x, c); break;
  }
}